

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeRegVmLower.cpp
# Opt level: O0

VmConstant *
GetLoadRegisterAndOffset
          (ExpressionContext *ctx,RegVmLoweredFunction *lowFunction,RegVmLoweredBlock *lowBlock,
          VmValue *address,VmValue *offset,uchar *addressReg)

{
  bool bVar1;
  uchar uVar2;
  ExpressionContext *pEVar3;
  VmConstant *constant;
  VmConstant *constantOffset;
  uchar *addressReg_local;
  VmValue *offset_local;
  VmValue *address_local;
  RegVmLoweredBlock *lowBlock_local;
  RegVmLoweredFunction *lowFunction_local;
  ExpressionContext *ctx_local;
  
  ctx_local = (ExpressionContext *)getType<VmConstant>(offset);
  pEVar3 = (ExpressionContext *)GetAddressInContainer(address);
  if (pEVar3 == (ExpressionContext *)0x0) {
    uVar2 = GetArgumentRegister(ctx,lowFunction,lowBlock,address);
    *addressReg = uVar2;
  }
  else {
    if (*(int *)((ctx_local->uniqueDependencies).little + 0xd) != 0) {
      __assert_fail("constantOffset->iValue == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeRegVmLower.cpp"
                    ,0x280,
                    "VmConstant *GetLoadRegisterAndOffset(ExpressionContext &, RegVmLoweredFunction *, RegVmLoweredBlock *, VmValue *, VmValue *, unsigned char &)"
                   );
    }
    bVar1 = IsLocalScope((ScopeData *)((pEVar3->uniqueDependencies).little[0x13]->name).end);
    *addressReg = bVar1;
    ctx_local = pEVar3;
  }
  return (VmConstant *)ctx_local;
}

Assistant:

VmConstant* GetLoadRegisterAndOffset(ExpressionContext &ctx, RegVmLoweredFunction *lowFunction, RegVmLoweredBlock *lowBlock, VmValue *address, VmValue *offset, unsigned char &addressReg)
{
	VmConstant *constantOffset = getType<VmConstant>(offset);

	if(VmConstant *constant = GetAddressInContainer(address))
	{
		assert(constantOffset->iValue == 0);

		addressReg = IsLocalScope(constant->container->scope) ? rvrrFrame : rvrrGlobals;

		return constant;
	}

	addressReg = GetArgumentRegister(ctx, lowFunction, lowBlock, address);

	return constantOffset;
}